

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  MessageBuilder *this_00;
  Level level;
  LineNumber line;
  Logger *pLVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  LogMessage msg;
  allocator local_1ea;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  DispatchAction local_198 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  char *local_180;
  VerboseLevel local_178;
  undefined6 uStack_176;
  Logger *local_170;
  undefined1 local_168 [16];
  char *local_158;
  DispatchAction local_150;
  _Alloc_hider local_148;
  pointer pbStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [17];
  
  if (this->m_proceed == true) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this->m_msg ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      level = this->m_level;
      std::__cxx11::string::string((string *)&local_1e8,this->m_file,&local_1e9);
      line = this->m_line;
      std::__cxx11::string::string((string *)&local_1c8,this->m_func,&local_1ea);
      LogMessage::LogMessage
                ((LogMessage *)local_1a8,level,&local_1e8,line,&local_1c8,this->m_verboseLevel,
                 this->m_logger);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
          &local_1e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_))
        ;
      }
      local_1e8._M_dataplus._M_p._0_1_ = this->m_proceed;
      local_1e8.field_2._M_allocated_capacity._0_4_ = this->m_dispatchAction;
      local_1e8._M_string_length = (size_type)local_1a8;
      LogDispatcher::dispatch((LogDispatcher *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != local_138) {
        operator_delete(local_148._M_p);
      }
      if ((undefined1 *)CONCAT62(uStack_176,local_178) != local_168) {
        operator_delete((undefined1 *)CONCAT62(uStack_176,local_178));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._8_8_ != &local_190) {
        operator_delete((void *)local_1a8._8_8_);
      }
    }
    else {
      local_198[0] = this->m_dispatchAction;
      local_1a8[0] = true;
      local_1a8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)this->m_msg;
      LogDispatcher::dispatch((LogDispatcher *)local_1a8);
    }
  }
  pLVar1 = this->m_logger;
  if (pLVar1 != (Logger *)0x0) {
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    std::__cxx11::stringbuf::str((string *)&pLVar1->field_0x58);
    if ((DispatchAction *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed == true) && (this->m_level == Fatal)) &&
     ((*(byte *)(elStorage + 0x18) & 8) == 0)) {
    local_190._M_allocated_capacity = (size_type)this->m_file;
    local_190._8_8_ = this->m_line;
    local_180 = this->m_func;
    local_1a8._0_8_ = &PTR__Writer_00129fb8;
    local_1a8._8_8_ = (LogMessage *)0x0;
    local_198[0] = 0x20;
    local_178 = 0;
    local_170 = (Logger *)0x0;
    local_168[0] = 0;
    local_168._8_8_ = 0;
    local_158 = "";
    local_150 = NormalLog;
    local_148._M_p = (pointer)0x0;
    pbStack_140 = (pointer)0x0;
    local_138[0]._M_allocated_capacity = 0;
    construct((Writer *)local_1a8,1,"default");
    this_00 = (MessageBuilder *)(local_168 + 8);
    if (local_168[0] == 1) {
      MessageBuilder::operator<<(this_00,"Aborting application. Reason: Fatal log at [");
    }
    if ((local_168[0] & 1) != 0) {
      MessageBuilder::operator<<(this_00,this->m_file);
    }
    if ((local_168[0] & 1) != 0) {
      MessageBuilder::operator<<(this_00,":");
    }
    if ((local_168[0] & 1) != 0) {
      MessageBuilder::operator<<(this_00,this->m_line);
    }
    if ((local_168[0] & 1) != 0) {
      MessageBuilder::operator<<(this_00,"]");
    }
    ~Writer((Writer *)local_1a8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Fatal log at [",0xe);
    __s = this->m_file;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 +
                      (int)*(undefined8 *)(CONCAT44(local_198[1],local_198[0]) + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," If you wish to disable \'abort on fatal log\' please use ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)",
               0x48);
    std::__cxx11::stringbuf::str();
    abort();
  }
  this->m_proceed = false;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    if (m_msg == nullptr) {
      LogMessage msg(m_level, m_file, m_line, m_func, m_verboseLevel,
                     m_logger);
      base::LogDispatcher(m_proceed, &msg, m_dispatchAction).dispatch();
    } else {
      base::LogDispatcher(m_proceed, m_msg, m_dispatchAction).dispatch();
    }
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}